

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_nodes.cpp
# Opt level: O2

void __thiscall duckdb::MultiFileOptions::Serialize(MultiFileOptions *this,Serializer *serializer)

{
  allocator local_41;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  Serializer::WritePropertyWithDefault<bool>(serializer,100,"filename",&this->filename);
  Serializer::WritePropertyWithDefault<bool>
            (serializer,0x65,"hive_partitioning",&this->hive_partitioning);
  Serializer::WritePropertyWithDefault<bool>
            (serializer,0x66,"auto_detect_hive_partitioning",&this->auto_detect_hive_partitioning);
  Serializer::WritePropertyWithDefault<bool>(serializer,0x67,"union_by_name",&this->union_by_name);
  Serializer::WritePropertyWithDefault<bool>
            (serializer,0x68,"hive_types_autocast",&this->hive_types_autocast);
  Serializer::
  WritePropertyWithDefault<std::unordered_map<std::__cxx11::string,duckdb::LogicalType,duckdb::CaseInsensitiveStringHashFunction,duckdb::CaseInsensitiveStringEquality,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>>>
            (serializer,0x69,"hive_types_schema",&this->hive_types_schema);
  ::std::__cxx11::string::string((string *)&local_40,"filename",&local_41);
  Serializer::WritePropertyWithDefault<std::__cxx11::string>
            (serializer,0x6a,"filename_column",&this->filename_column,&local_40);
  ::std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void MultiFileOptions::Serialize(Serializer &serializer) const {
	serializer.WritePropertyWithDefault<bool>(100, "filename", filename);
	serializer.WritePropertyWithDefault<bool>(101, "hive_partitioning", hive_partitioning);
	serializer.WritePropertyWithDefault<bool>(102, "auto_detect_hive_partitioning", auto_detect_hive_partitioning);
	serializer.WritePropertyWithDefault<bool>(103, "union_by_name", union_by_name);
	serializer.WritePropertyWithDefault<bool>(104, "hive_types_autocast", hive_types_autocast);
	serializer.WritePropertyWithDefault<case_insensitive_map_t<LogicalType>>(105, "hive_types_schema", hive_types_schema);
	serializer.WritePropertyWithDefault<string>(106, "filename_column", filename_column, MultiFileOptions::DEFAULT_FILENAME_COLUMN);
}